

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

Result __thiscall tcu::ThreadUtil::Event::waitReady(Event *this)

{
  Event *this_local;
  
  de::Mutex::lock(&this->m_lock);
  if (this->m_result == RESULT_NOT_READY) {
    this->m_waiterCount = this->m_waiterCount + 1;
    de::Mutex::unlock(&this->m_lock);
    de::Semaphore::decrement(&this->m_waiters);
    this_local._4_4_ = this->m_result;
  }
  else {
    de::Mutex::unlock(&this->m_lock);
    this_local._4_4_ = this->m_result;
  }
  return this_local._4_4_;
}

Assistant:

Event::Result Event::waitReady (void)
{
	m_lock.lock();

	if (m_result == RESULT_NOT_READY)
		m_waiterCount++;
	else
	{
		m_lock.unlock();
		return m_result;
	}

	m_lock.unlock();

	m_waiters.decrement();

	return m_result;
}